

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

spv_result_t
spvBinaryToText(spv_const_context context,uint32_t *code,size_t wordCount,uint32_t options,
               spv_text *pText,spv_diagnostic *pDiagnostic)

{
  _Manager_type p_Var1;
  undefined1 auVar2 [16];
  _Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false> this;
  bool bVar3;
  spv_result_t sVar4;
  FriendlyNameMapper *this_00;
  NameMapper name_mapper;
  Disassembler disassembler;
  _Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false> local_338;
  spv_text *local_330;
  _Any_data local_328;
  code *local_318;
  undefined8 uStack_310;
  _Any_data local_308;
  undefined1 local_2f8 [16];
  spv_context_t local_2e8;
  undefined1 local_2a0 [24];
  spv_ext_inst_table local_288;
  _Any_data local_280;
  code *local_270;
  code *local_268;
  
  local_2e8.target_env = context->target_env;
  local_2e8._4_4_ = *(undefined4 *)&context->field_0x4;
  local_2e8.opcode_table = context->opcode_table;
  local_2e8.operand_table._0_4_ = *(undefined4 *)&context->operand_table;
  local_2e8.operand_table._4_4_ = *(undefined4 *)((long)&context->operand_table + 4);
  local_2e8.ext_inst_table._0_4_ = *(undefined4 *)&context->ext_inst_table;
  local_2e8.ext_inst_table._4_4_ = *(undefined4 *)((long)&context->ext_inst_table + 4);
  local_2e8.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_2e8.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_2e8.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_2e8.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (context->consumer).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&local_2e8.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_2e8.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
    local_2e8.consumer._M_invoker = (context->consumer)._M_invoker;
  }
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_2e8,pDiagnostic);
  }
  local_2a0._0_4_ = local_2e8.target_env;
  auVar2._8_4_ = local_2e8.operand_table._0_4_;
  auVar2._0_8_ = local_2e8.opcode_table;
  auVar2._12_4_ = local_2e8.operand_table._4_4_;
  local_2a0._8_8_ = auVar2._8_8_;
  local_2a0._16_4_ = (int)local_2e8.opcode_table;
  local_2a0._20_4_ = (int)((ulong)local_2e8.opcode_table >> 0x20);
  local_288 = (spv_ext_inst_table)
              CONCAT44(local_2e8.ext_inst_table._4_4_,local_2e8.ext_inst_table._0_4_);
  bVar3 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_2a0);
  sVar4 = SPV_ERROR_INVALID_TABLE;
  if (bVar3) {
    local_338._M_head_impl = (FriendlyNameMapper *)0x0;
    spvtools::GetTrivialNameMapper_abi_cxx11_();
    if ((options & 0x40) != 0) {
      local_330 = pText;
      this_00 = (FriendlyNameMapper *)operator_new(0x90);
      spvtools::FriendlyNameMapper::FriendlyNameMapper(this_00,&local_2e8,code,wordCount);
      std::
      __uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
      ::reset((__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
               *)&local_338,this_00);
      local_280._8_8_ = 0;
      local_280._M_unused._M_object = local_338._M_head_impl;
      local_268 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.h:73:12)>
                  ::_M_invoke;
      local_270 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.h:73:12)>
                  ::_M_manager;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&local_328,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&local_280);
      pText = local_330;
      if (local_270 != (code *)0x0) {
        (*local_270)(&local_280,&local_280,__destroy_functor);
        pText = local_330;
      }
    }
    local_308 = (_Any_data)0x0;
    local_2f8 = (undefined1  [16])0x0;
    if (local_318 != (code *)0x0) {
      (*local_318)(&local_308,&local_328,__clone_functor);
      local_2f8._8_8_ = uStack_310;
      local_2f8._0_8_ = local_318;
    }
    spvtools::anon_unknown_0::Disassembler::Disassembler
              ((Disassembler *)&local_280,(AssemblyGrammar *)local_2a0,options,
               (NameMapper *)&local_308);
    if ((code *)local_2f8._0_8_ != (code *)0x0) {
      (*(code *)local_2f8._0_8_)(&local_308,&local_308,__destroy_functor);
    }
    sVar4 = spvBinaryParse(&local_2e8,&local_280,code,wordCount,
                           spvtools::anon_unknown_0::DisassembleHeader,
                           spvtools::anon_unknown_0::DisassembleInstruction,pDiagnostic);
    if (sVar4 == SPV_SUCCESS) {
      spvtools::anon_unknown_0::Disassembler::SaveTextResult((Disassembler *)&local_280,pText);
    }
    spvtools::anon_unknown_0::Disassembler::~Disassembler((Disassembler *)&local_280);
    if (local_318 != (code *)0x0) {
      (*local_318)(&local_328,&local_328,__destroy_functor);
    }
    this._M_head_impl = local_338._M_head_impl;
    if (local_338._M_head_impl != (FriendlyNameMapper *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&((local_338._M_head_impl)->used_names_)._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this._M_head_impl);
      operator_delete(this._M_head_impl,0x90);
    }
  }
  if (local_2e8.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2e8.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_2e8.consumer,(_Any_data *)&local_2e8.consumer,__destroy_functor);
  }
  return sVar4;
}

Assistant:

spv_result_t spvBinaryToText(const spv_const_context context,
                             const uint32_t* code, const size_t wordCount,
                             const uint32_t options, spv_text* pText,
                             spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  const spvtools::AssemblyGrammar grammar(&hijack_context);
  if (!grammar.isValid()) return SPV_ERROR_INVALID_TABLE;

  // Generate friendly names for Ids if requested.
  std::unique_ptr<spvtools::FriendlyNameMapper> friendly_mapper;
  spvtools::NameMapper name_mapper = spvtools::GetTrivialNameMapper();
  if (options & SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES) {
    friendly_mapper = spvtools::MakeUnique<spvtools::FriendlyNameMapper>(
        &hijack_context, code, wordCount);
    name_mapper = friendly_mapper->GetNameMapper();
  }

  // Now disassemble!
  spvtools::Disassembler disassembler(grammar, options, name_mapper);
  if (auto error =
          spvBinaryParse(&hijack_context, &disassembler, code, wordCount,
                         spvtools::DisassembleHeader,
                         spvtools::DisassembleInstruction, pDiagnostic)) {
    return error;
  }

  return disassembler.SaveTextResult(pText);
}